

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

bool __thiscall Arc::operator<(Arc *this,Arc *o)

{
  bool local_29;
  bool local_19;
  Arc *o_local;
  Arc *this_local;
  
  local_19 = true;
  if ((o->u <= this->u) && ((this->u != o->u || (local_19 = true, o->v <= this->v)))) {
    local_29 = false;
    if ((this->u == o->u) && (local_29 = false, this->v == o->v)) {
      local_29 = this->label < o->label;
    }
    local_19 = local_29;
  }
  return local_19;
}

Assistant:

bool Arc::operator<(const Arc &o) const {
	return (u < o.u) ||
		   (u == o.u && v < o.v) ||
		   (u == o.u && v == o.v && label < o.label);
}